

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::LocalAccessChainConvertPass::ConvertLocalAccessChains
          (LocalAccessChainConvertPass *this,Function *func)

{
  bool bVar1;
  Op OVar2;
  Instruction *pIVar3;
  Instruction *original_load;
  size_type sVar4;
  IRContext *pIVar5;
  DebugInfoManager *pDVar6;
  reference ppIVar7;
  anon_class_8_1_fd9fcb40 local_100;
  function<void_(spvtools::opt::Instruction_*)> local_f8;
  Instruction *local_d8;
  Instruction *inst;
  size_t i;
  Instruction *local_c0;
  size_t num_of_instructions_to_skip;
  undefined1 local_b0 [4];
  uint32_t valId;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  newInsts;
  Instruction *ptrInst_1;
  Instruction *store;
  uint32_t varId_1;
  Instruction *ptrInst;
  undefined1 local_70 [4];
  uint32_t varId;
  undefined1 local_68 [8];
  iterator ii;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  dead_instructions;
  undefined1 local_38 [8];
  iterator bi;
  bool modified;
  Function *func_local;
  LocalAccessChainConvertPass *this_local;
  
  FindTargetVars(this,func);
  bi.iterator_._M_current._7_1_ = 0;
  _local_38 = Function::begin(func);
  do {
    join_0x00000010_0x00000000_ = Function::end(func);
    bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38,
                       (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                       &dead_instructions.
                        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      this_local._4_4_ = SuccessWithoutChange;
      if ((bi.iterator_._M_current._7_1_ & 1) != 0) {
        this_local._4_4_ = SuccessWithChange;
      }
      return this_local._4_4_;
    }
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&ii);
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38);
    BasicBlock::begin((BasicBlock *)local_68);
    while( true ) {
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38);
      BasicBlock::end((BasicBlock *)local_70);
      bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_68,
                                (iterator_template<spvtools::opt::Instruction> *)local_70);
      if (!bVar1) break;
      pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)local_68);
      OVar2 = Instruction::opcode(pIVar3);
      if (OVar2 == OpLoad) {
        pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*
                           ((iterator_template<spvtools::opt::Instruction> *)local_68);
        _varId_1 = MemPass::GetPtr(&this->super_MemPass,pIVar3,(uint32_t *)((long)&ptrInst + 4));
        OVar2 = Instruction::opcode(_varId_1);
        bVar1 = MemPass::IsNonPtrAccessChain(&this->super_MemPass,OVar2);
        if ((bVar1) &&
           (bVar1 = MemPass::IsTargetVar(&this->super_MemPass,ptrInst._4_4_), pIVar3 = _varId_1,
           bVar1)) {
          original_load =
               utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)local_68);
          bVar1 = ReplaceAccessChainLoad(this,pIVar3,original_load);
          if (!bVar1) {
            this_local._4_4_ = Failure;
            store._4_4_ = 1;
            goto LAB_003e1f9f;
          }
          bi.iterator_._M_current._7_1_ = 1;
        }
      }
      else if (OVar2 == OpStore) {
        ptrInst_1 = utils::IntrusiveList<spvtools::opt::Instruction>::
                    iterator_template<spvtools::opt::Instruction>::operator*
                              ((iterator_template<spvtools::opt::Instruction> *)local_68);
        newInsts.
        super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)MemPass::GetPtr(&this->super_MemPass,ptrInst_1,(uint32_t *)&store);
        OVar2 = Instruction::opcode((Instruction *)
                                    newInsts.
                                    super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar1 = MemPass::IsNonPtrAccessChain(&this->super_MemPass,OVar2);
        if ((bVar1) && (bVar1 = MemPass::IsTargetVar(&this->super_MemPass,(uint32_t)store), bVar1))
        {
          std::
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          ::vector((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                    *)local_b0);
          num_of_instructions_to_skip._4_4_ = Instruction::GetSingleWordInOperand(ptrInst_1,1);
          bVar1 = GenAccessChainStoreReplacement
                            (this,(Instruction *)
                                  newInsts.
                                  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             num_of_instructions_to_skip._4_4_,
                             (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                              *)local_b0);
          if (bVar1) {
            sVar4 = std::
                    vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                    ::size((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                            *)local_b0);
            local_c0 = (Instruction *)(sVar4 - 1);
            std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         *)&ii,&ptrInst_1);
            InstructionList::iterator::operator++((iterator *)local_68);
            InstructionList::iterator::InsertBefore
                      ((iterator *)&i,
                       (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                        *)local_68);
            InstructionList::iterator::operator=((iterator *)local_68,(iterator *)&i);
            for (inst = (Instruction *)0x0; inst < local_c0;
                inst = (Instruction *)
                       ((long)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                               _vptr_IntrusiveNodeBase + 1)) {
              pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
                       iterator_template<spvtools::opt::Instruction>::operator->
                                 ((iterator_template<spvtools::opt::Instruction> *)local_68);
              Instruction::UpdateDebugInfoFrom(pIVar3,ptrInst_1);
              pIVar5 = Pass::context((Pass *)this);
              pDVar6 = IRContext::get_debug_info_mgr(pIVar5);
              pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
                       iterator_template<spvtools::opt::Instruction>::operator*
                                 ((iterator_template<spvtools::opt::Instruction> *)local_68);
              analysis::DebugInfoManager::AnalyzeDebugInst(pDVar6,pIVar3);
              InstructionList::iterator::operator++((iterator *)local_68);
            }
            pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
                     iterator_template<spvtools::opt::Instruction>::operator->
                               ((iterator_template<spvtools::opt::Instruction> *)local_68);
            Instruction::UpdateDebugInfoFrom(pIVar3,ptrInst_1);
            pIVar5 = Pass::context((Pass *)this);
            pDVar6 = IRContext::get_debug_info_mgr(pIVar5);
            pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
                     iterator_template<spvtools::opt::Instruction>::operator*
                               ((iterator_template<spvtools::opt::Instruction> *)local_68);
            analysis::DebugInfoManager::AnalyzeDebugInst(pDVar6,pIVar3);
            bi.iterator_._M_current._7_1_ = 1;
            store._4_4_ = 0;
          }
          else {
            this_local._4_4_ = Failure;
            store._4_4_ = 1;
          }
          std::
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          ::~vector((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                     *)local_b0);
          if (store._4_4_ != 0) goto LAB_003e1f9f;
        }
      }
      InstructionList::iterator::operator++((iterator *)local_68);
    }
    while (bVar1 = std::
                   vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ::empty((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            *)&ii), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppIVar7 = std::
                vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ::back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        *)&ii);
      local_d8 = *ppIVar7;
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      pop_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&ii);
      pIVar3 = local_d8;
      local_100.dead_instructions =
           (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
           &ii;
      std::function<void(spvtools::opt::Instruction*)>::
      function<spvtools::opt::LocalAccessChainConvertPass::ConvertLocalAccessChains(spvtools::opt::Function*)::__0,void>
                ((function<void(spvtools::opt::Instruction*)> *)&local_f8,&local_100);
      MemPass::DCEInst(&this->super_MemPass,pIVar3,&local_f8);
      std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_f8);
    }
    store._4_4_ = 0;
LAB_003e1f9f:
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            &ii);
    if (store._4_4_ != 0) {
      return this_local._4_4_;
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38);
  } while( true );
}

Assistant:

Pass::Status LocalAccessChainConvertPass::ConvertLocalAccessChains(
    Function* func) {
  FindTargetVars(func);
  // Replace access chains of all targeted variables with equivalent
  // extract and insert sequences
  bool modified = false;
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    std::vector<Instruction*> dead_instructions;
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      switch (ii->opcode()) {
        case spv::Op::OpLoad: {
          uint32_t varId;
          Instruction* ptrInst = GetPtr(&*ii, &varId);
          if (!IsNonPtrAccessChain(ptrInst->opcode())) break;
          if (!IsTargetVar(varId)) break;
          if (!ReplaceAccessChainLoad(ptrInst, &*ii)) {
            return Status::Failure;
          }
          modified = true;
        } break;
        case spv::Op::OpStore: {
          uint32_t varId;
          Instruction* store = &*ii;
          Instruction* ptrInst = GetPtr(store, &varId);
          if (!IsNonPtrAccessChain(ptrInst->opcode())) break;
          if (!IsTargetVar(varId)) break;
          std::vector<std::unique_ptr<Instruction>> newInsts;
          uint32_t valId = store->GetSingleWordInOperand(kStoreValIdInIdx);
          if (!GenAccessChainStoreReplacement(ptrInst, valId, &newInsts)) {
            return Status::Failure;
          }
          size_t num_of_instructions_to_skip = newInsts.size() - 1;
          dead_instructions.push_back(store);
          ++ii;
          ii = ii.InsertBefore(std::move(newInsts));
          for (size_t i = 0; i < num_of_instructions_to_skip; ++i) {
            ii->UpdateDebugInfoFrom(store);
            context()->get_debug_info_mgr()->AnalyzeDebugInst(&*ii);
            ++ii;
          }
          ii->UpdateDebugInfoFrom(store);
          context()->get_debug_info_mgr()->AnalyzeDebugInst(&*ii);
          modified = true;
        } break;
        default:
          break;
      }
    }

    while (!dead_instructions.empty()) {
      Instruction* inst = dead_instructions.back();
      dead_instructions.pop_back();
      DCEInst(inst, [&dead_instructions](Instruction* other_inst) {
        auto i = std::find(dead_instructions.begin(), dead_instructions.end(),
                           other_inst);
        if (i != dead_instructions.end()) {
          dead_instructions.erase(i);
        }
      });
    }
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}